

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_ConvertToRgb(ConvertToRgbForm3 ConvertToRgb)

{
  uint8_t value;
  const_reference pvVar1;
  code *in_RDI;
  Image output;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined4 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2d;
  undefined1 in_stack_ffffffffffffff2e;
  byte bVar2;
  undefined1 in_stack_ffffffffffffff2f;
  Image *image;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t width_;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 uVar4;
  Image *in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff54;
  uint32_t in_stack_ffffffffffffff58;
  uint8_t in_stack_ffffffffffffff5f;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined1 local_48 [40];
  code *local_8;
  
  image = (Image *)&stack0xffffffffffffffe0;
  uVar3 = 1;
  local_8 = in_RDI;
  Unit_Test::intensityArray
            (CONCAT13(in_stack_ffffffffffffff2f,
                      CONCAT12(in_stack_ffffffffffffff2e,
                               CONCAT11(in_stack_ffffffffffffff2d,in_stack_ffffffffffffff2c))));
  width_ = 0;
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image,0);
  uVar4 = CONCAT13(*pvVar1,(int3)in_stack_ffffffffffffff44);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(uVar4,uVar3),width_,in_stack_ffffffffffffff38,
             (uint8_t)((ulong)image >> 0x38),(uint8_t)((ulong)image >> 0x30));
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
             in_stack_ffffffffffffff48);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d1c15);
  Unit_Test::generateRoi
            ((Image *)CONCAT44(uVar4,uVar3),(uint32_t *)CONCAT44(width_,in_stack_ffffffffffffff38),
             (uint32_t *)image,
             (uint32_t *)
             CONCAT17(in_stack_ffffffffffffff2f,
                      CONCAT16(in_stack_ffffffffffffff2e,
                               CONCAT15(in_stack_ffffffffffffff2d,
                                        CONCAT14(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28
                                                )))),(uint32_t *)0x1d1c36);
  (*local_8)(&stack0xffffffffffffff48,local_48,local_80,local_84,local_88,local_8c);
  value = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount
                    ((ImageTemplate<unsigned_char> *)&stack0xffffffffffffff48);
  bVar2 = false;
  if (value == '\x03') {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffe0,0);
    bVar2 = Unit_Test::verifyImage(image,value);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d1cc5);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d1cd2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar4,uVar3));
  return (bool)(bVar2 & 1);
}

Assistant:

bool form3_ConvertToRgb(ConvertToRgbForm3 ConvertToRgb)
    {
        const std::vector < uint8_t > intensity = intensityArray( 1 );
        const PenguinV_Image::Image input = uniformImage( intensity[0] );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const PenguinV_Image::Image output = ConvertToRgb( input, roiX, roiY, roiWidth, roiHeight );

        return output.colorCount() == PenguinV_Image::RGB && verifyImage( output, intensity[0] );
    }